

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cc
# Opt level: O3

string * __thiscall
phosg::format_time_natural_abi_cxx11_(string *__return_storage_ptr__,phosg *this,timeval *tv)

{
  undefined1 auVar1 [16];
  time_t sec;
  timeval local_tv;
  tm cooked;
  
  if (this == (phosg *)0x0) {
    this = (phosg *)&local_tv;
    gettimeofday((timeval *)this,(__timezone_ptr_t)0x0);
  }
  sec = ((timeval *)this)->tv_sec;
  localtime_r(&sec,(tm *)&cooked);
  auVar1 = SEXT816(0x20c49ba5e353f7cf) * SEXT816(((timeval *)this)->tv_usec);
  string_printf_abi_cxx11_
            (__return_storage_ptr__,"%u %s %4u %02u:%02u:%02u.%03hu",(ulong)(uint)cooked.tm_mday,
             _ZZN5phosg19format_time_naturalB5cxx11EP7timevalE10monthnames_rel +
             *(int *)(_ZZN5phosg19format_time_naturalB5cxx11EP7timevalE10monthnames_rel +
                     (long)cooked.tm_mon * 4),(ulong)(cooked.tm_year + 0x76c),
             (ulong)(uint)cooked.tm_hour,(ulong)(uint)cooked.tm_min,(ulong)(uint)cooked.tm_sec,
             (ulong)((auVar1._8_4_ >> 7) - (auVar1._12_4_ >> 0x1f) & 0xffff));
  return __return_storage_ptr__;
}

Assistant:

string format_time_natural(struct timeval* tv) {
  struct timeval local_tv;
  if (!tv) {
    tv = &local_tv;
    gettimeofday(tv, nullptr);
  }

  time_t sec = tv->tv_sec;
  struct tm cooked;
  localtime_r(&sec, &cooked);

  static const char* monthnames[] = {"January", "February", "March", "April",
      "May", "June", "July", "August", "September", "October", "November",
      "December"};

  return string_printf("%u %s %4u %02u:%02u:%02u.%03hu", cooked.tm_mday,
      monthnames[cooked.tm_mon], cooked.tm_year + 1900,
      cooked.tm_hour, cooked.tm_min, cooked.tm_sec,
      static_cast<uint16_t>(tv->tv_usec / 1000));
}